

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O1

char * google::protobuf::internal::TcParser::FastV32S1
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  uint uVar1;
  ushort *puVar2;
  char *pcVar3;
  uint *puVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  if (data.field_0._0_1_ != '\0') {
    pcVar3 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar3;
  }
  uVar5 = (ulong)ptr[1];
  if ((long)uVar5 < 0) {
    uVar6 = (long)ptr[2] << 7 | 0x7f;
    if ((long)uVar6 < 0) {
      uVar7 = (long)ptr[3] << 0xe | 0x3fff;
      if ((long)uVar7 < 0) {
        uVar6 = ((long)ptr[4] << 0x15 | 0x1fffffU) & uVar6;
        if ((long)uVar6 < 0) {
          uVar7 = ((long)ptr[5] << 0x1c | 0xfffffffU) & uVar7;
          if ((long)uVar7 < 0) {
            if (ptr[6] < '\0') {
              if (ptr[7] < '\0') {
                if (ptr[8] < '\0') {
                  if (ptr[9] < '\0') {
                    puVar2 = (ushort *)(ptr + 0xb);
                    if ((ptr[10] != '\x01') && (ptr[10] < '\0')) {
                      puVar2 = (ushort *)0x0;
                      goto LAB_002946ad;
                    }
                  }
                  else {
                    puVar2 = (ushort *)(ptr + 10);
                  }
                }
                else {
                  puVar2 = (ushort *)(ptr + 9);
                }
              }
              else {
                puVar2 = (ushort *)(ptr + 8);
              }
            }
            else {
              puVar2 = (ushort *)(ptr + 7);
            }
          }
          else {
            puVar2 = (ushort *)(ptr + 6);
          }
        }
        else {
          puVar2 = (ushort *)(ptr + 5);
        }
      }
      else {
        puVar2 = (ushort *)(ptr + 4);
      }
      uVar6 = uVar7 & uVar6;
    }
    else {
      puVar2 = (ushort *)(ptr + 3);
    }
    uVar5 = uVar5 & uVar6;
  }
  else {
    puVar2 = (ushort *)(ptr + 2);
  }
LAB_002946ad:
  if (puVar2 == (ushort *)0x0) {
    pcVar3 = Error(msg,(char *)0x0,ctx,data,table,hasbits);
    return pcVar3;
  }
  puVar4 = (uint *)((long)&msg->_vptr_MessageLite + ((ulong)data.field_0 >> 0x30));
  if (((ulong)puVar4 & 3) != 0) {
LAB_00294787:
    AlignFail(puVar4);
  }
  *puVar4 = (uint)uVar5;
  if (puVar2 < (ctx->super_EpsCopyInputStream).limit_end_) {
    uVar1 = (uint)table->fast_idx_mask & (uint)*puVar2;
    if ((uVar1 & 7) != 0) {
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x44d);
    }
    pcVar3 = (char *)(**(code **)(&table[1].has_bits_offset + (uVar1 & 0xfffffff8)))();
    return pcVar3;
  }
  if ((ulong)table->has_bits_offset != 0) {
    puVar4 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
    if (((ulong)puVar4 & 3) != 0) goto LAB_00294787;
    *puVar4 = *puVar4 | (uint)hasbits | (uint)(1L << ((ulong)data.field_0 >> 0x10 & 0x3f));
  }
  return (char *)puVar2;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastV32S1(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return FastVarintS1<uint32_t>(PROTOBUF_TC_PARAM_PASS);
}